

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedCombinedCase::runComputeShader
          (ComputeShaderGeneratedCombinedCase *this)

{
  DrawMethod DVar1;
  code *pcVar2;
  IVec3 *pIVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  TestLog *pTVar10;
  MessageBuilder *pMVar11;
  int size;
  int size_00;
  int size_01;
  byte local_c15;
  uint local_c14;
  int *local_b98;
  MessageBuilder local_b88;
  string local_a08;
  MessageBuilder local_9e8;
  MessageBuilder local_868;
  uint local_6e8;
  uint local_6e4;
  int bufferSize_2;
  int bindingPoint_2;
  MessageBuilder local_6c0;
  MessageBuilder local_540;
  uint local_3c0;
  uint local_3bc;
  int bufferSize_1;
  int bindingPoint_1;
  MessageBuilder local_398;
  MessageBuilder local_208;
  uint local_84;
  int local_80;
  int bufferSize;
  int bindingPoint;
  undefined1 local_70 [8];
  IVec3 dispatchSize;
  IVec3 dataBufferDispatchSize;
  IVec3 indexBufferDispatchSize;
  IVec3 drawArraysDataBufferDispatchSize;
  IVec3 drawElementsDataBufferDispatchSize;
  IVec3 commandDispatchSize;
  IVec3 nullSize;
  bool indexed;
  Functions *gl;
  ComputeShaderGeneratedCombinedCase *this_local;
  long lVar9;
  
  pRVar8 = gles31::Context::getRenderContext
                     ((this->super_ComputeShaderGeneratedCase).super_TestCase.m_context);
  iVar4 = (*pRVar8->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar4);
  DVar1 = (this->super_ComputeShaderGeneratedCase).m_drawMethod;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(commandDispatchSize.m_data + 1),0,0,0);
  if (((this->super_ComputeShaderGeneratedCase).m_computeCmd & 1U) == 0) {
    tcu::Vector<int,_3>::Vector
              ((Vector<int,_3> *)(drawElementsDataBufferDispatchSize.m_data + 1),
               (Vector<int,_3> *)(commandDispatchSize.m_data + 1));
  }
  else {
    tcu::Vector<int,_3>::Vector
              ((Vector<int,_3> *)(drawElementsDataBufferDispatchSize.m_data + 1),
               (this->super_ComputeShaderGeneratedCase).m_numDrawCmds,1,1);
  }
  if (((this->super_ComputeShaderGeneratedCase).m_computeData & 1U) == 0) {
    tcu::Vector<int,_3>::Vector
              ((Vector<int,_3> *)(drawArraysDataBufferDispatchSize.m_data + 1),
               (Vector<int,_3> *)(commandDispatchSize.m_data + 1));
  }
  else {
    tcu::Vector<int,_3>::Vector
              ((Vector<int,_3> *)(drawArraysDataBufferDispatchSize.m_data + 1),
               (this->super_ComputeShaderGeneratedCase).m_gridSize + 1,
               (this->super_ComputeShaderGeneratedCase).m_gridSize + 1,1);
  }
  if (((this->super_ComputeShaderGeneratedCase).m_computeData & 1U) == 0) {
    tcu::Vector<int,_3>::Vector
              ((Vector<int,_3> *)(indexBufferDispatchSize.m_data + 1),
               (Vector<int,_3> *)(commandDispatchSize.m_data + 1));
  }
  else {
    tcu::Vector<int,_3>::Vector
              ((Vector<int,_3> *)(indexBufferDispatchSize.m_data + 1),
               (this->super_ComputeShaderGeneratedCase).m_gridSize,
               (this->super_ComputeShaderGeneratedCase).m_gridSize,1);
  }
  if ((((this->super_ComputeShaderGeneratedCase).m_computeIndices & 1U) == 0) ||
     (DVar1 != DRAWMETHOD_DRAWELEMENTS)) {
    tcu::Vector<int,_3>::Vector
              ((Vector<int,_3> *)(dataBufferDispatchSize.m_data + 1),
               (Vector<int,_3> *)(commandDispatchSize.m_data + 1));
  }
  else {
    tcu::Vector<int,_3>::Vector
              ((Vector<int,_3> *)(dataBufferDispatchSize.m_data + 1),
               (this->super_ComputeShaderGeneratedCase).m_gridSize,
               (this->super_ComputeShaderGeneratedCase).m_gridSize,1);
  }
  if ((this->super_ComputeShaderGeneratedCase).m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
    pIVar3 = &drawArraysDataBufferDispatchSize;
  }
  else {
    pIVar3 = &indexBufferDispatchSize;
  }
  local_b98 = pIVar3->m_data + 1;
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(dispatchSize.m_data + 1),(Vector<int,_3> *)local_b98);
  tcu::max<int,3>((tcu *)&bufferSize,
                  (Vector<int,_3> *)(drawElementsDataBufferDispatchSize.m_data + 1),
                  (Vector<int,_3> *)(dispatchSize.m_data + 1));
  tcu::max<int,3>((tcu *)local_70,(Vector<int,_3> *)&bufferSize,
                  (Vector<int,_3> *)(dataBufferDispatchSize.m_data + 1));
  pcVar2 = *(code **)(lVar9 + 0x1680);
  dVar5 = glu::ShaderProgram::getProgram(this->m_computeProgram);
  (*pcVar2)(dVar5);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"use compute shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x665);
  if (((this->super_ComputeShaderGeneratedCase).m_computeCmd & 1U) != 0) {
    local_80 = 0;
    local_84 = (this->super_ComputeShaderGeneratedCase).m_commandSize *
               (this->super_ComputeShaderGeneratedCase).m_numDrawCmds;
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_208,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_208,(char (*) [41])"Binding command buffer to binding point ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_80);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_208);
    (**(code **)(lVar9 + 0x48))(0x90d2,0,(this->super_ComputeShaderGeneratedCase).m_cmdBufferID);
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_398,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_398,(char (*) [44])"Allocating memory for command buffer, size ");
    Functional::(anonymous_namespace)::sizeToString_abi_cxx11_
              ((string *)&bufferSize_1,(_anonymous_namespace_ *)(ulong)local_84,size);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&bufferSize_1);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2b6cb9a);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&bufferSize_1);
    tcu::MessageBuilder::~MessageBuilder(&local_398);
    (**(code **)(lVar9 + 0x150))(0x90d2,(long)(int)local_84,0,0x88e8);
  }
  if (((this->super_ComputeShaderGeneratedCase).m_computeData & 1U) != 0) {
    local_3bc = (this->super_ComputeShaderGeneratedCase).m_computeCmd & 1;
    dVar5 = ComputeShaderGeneratedCase::calcDrawBufferSize(&this->super_ComputeShaderGeneratedCase);
    local_3c0 = dVar5 << 4;
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_540,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_540,(char (*) [38])"Binding data buffer to binding point ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(int *)&local_3bc);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_540);
    (**(code **)(lVar9 + 0x48))
              (0x90d2,local_3bc,(this->super_ComputeShaderGeneratedCase).m_dataBufferID);
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_6c0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_6c0,(char (*) [41])"Allocating memory for data buffer, size ");
    Functional::(anonymous_namespace)::sizeToString_abi_cxx11_
              ((string *)&bufferSize_2,(_anonymous_namespace_ *)(ulong)local_3c0,size_00);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&bufferSize_2);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2b6cb9a);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&bufferSize_2);
    tcu::MessageBuilder::~MessageBuilder(&local_6c0);
    (**(code **)(lVar9 + 0x150))(0x90d2,(long)(int)local_3c0,0,0x88e8);
  }
  if (((this->super_ComputeShaderGeneratedCase).m_computeIndices & 1U) != 0) {
    if ((((this->super_ComputeShaderGeneratedCase).m_computeCmd & 1U) == 0) ||
       (((this->super_ComputeShaderGeneratedCase).m_computeData & 1U) == 0)) {
      local_c15 = 1;
      if (((this->super_ComputeShaderGeneratedCase).m_computeCmd & 1U) == 0) {
        local_c15 = (this->super_ComputeShaderGeneratedCase).m_computeData;
      }
      local_c14 = (uint)((local_c15 & 1) != 0);
    }
    else {
      local_c14 = 2;
    }
    local_6e4 = local_c14;
    dVar5 = ComputeShaderGeneratedCase::calcIndexBufferSize(&this->super_ComputeShaderGeneratedCase)
    ;
    local_6e8 = dVar5 << 2;
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_868,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_868,(char (*) [39])"Binding index buffer to binding point ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(int *)&local_6e4);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_868);
    (**(code **)(lVar9 + 0x48))
              (0x90d2,local_6e4,(this->super_ComputeShaderGeneratedCase).m_indexBufferID);
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_9e8,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_9e8,(char (*) [42])"Allocating memory for index buffer, size ");
    Functional::(anonymous_namespace)::sizeToString_abi_cxx11_
              (&local_a08,(_anonymous_namespace_ *)(ulong)local_6e8,size_01);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_a08);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2b6cb9a);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_a08);
    tcu::MessageBuilder::~MessageBuilder(&local_9e8);
    (**(code **)(lVar9 + 0x150))(0x90d2,(long)(int)local_6e8,0,0x88e8);
  }
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"setup buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x68d);
  pTVar10 = tcu::TestContext::getLog
                      ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_b88,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar11 = tcu::MessageBuilder::operator<<
                      (&local_b88,(char (*) [29])"Dispatching compute, size = ");
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(Vector<int,_3> *)local_70);
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_b88);
  pcVar2 = *(code **)(lVar9 + 0x528);
  iVar4 = tcu::Vector<int,_3>::x((Vector<int,_3> *)local_70);
  iVar6 = tcu::Vector<int,_3>::y((Vector<int,_3> *)local_70);
  iVar7 = tcu::Vector<int,_3>::z((Vector<int,_3> *)local_70);
  (*pcVar2)(iVar4,iVar6,iVar7);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"calculate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x694);
  return;
}

Assistant:

void ComputeShaderGeneratedCombinedCase::runComputeShader (void)
{
	const glw::Functions&	gl									= m_context.getRenderContext().getFunctions();
	const bool				indexed								= (m_drawMethod == DRAWMETHOD_DRAWELEMENTS);
	const tcu::IVec3		nullSize							(0, 0, 0);
	const tcu::IVec3		commandDispatchSize					= (m_computeCmd)				? (tcu::IVec3(m_numDrawCmds, 1, 1))				: (nullSize);
	const tcu::IVec3		drawElementsDataBufferDispatchSize	= (m_computeData)				? (tcu::IVec3(m_gridSize+1, m_gridSize+1, 1))	: (nullSize);
	const tcu::IVec3		drawArraysDataBufferDispatchSize	= (m_computeData)				? (tcu::IVec3(m_gridSize,   m_gridSize,   1))	: (nullSize);
	const tcu::IVec3		indexBufferDispatchSize				= (m_computeIndices && indexed)	? (tcu::IVec3(m_gridSize,   m_gridSize,   1))	: (nullSize);

	const tcu::IVec3		dataBufferDispatchSize				= (m_drawMethod == DRAWMETHOD_DRAWELEMENTS) ? (drawElementsDataBufferDispatchSize) : (drawArraysDataBufferDispatchSize);
	const tcu::IVec3		dispatchSize						= tcu::max(tcu::max(commandDispatchSize, dataBufferDispatchSize), indexBufferDispatchSize);

	gl.useProgram(m_computeProgram->getProgram());
	glu::checkError(gl.getError(), "use compute shader", __FILE__, __LINE__);

	// setup buffers

	if (m_computeCmd)
	{
		const int			bindingPoint	= 0;
		const int			bufferSize		= m_commandSize * m_numDrawCmds;

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding command buffer to binding point " << bindingPoint << tcu::TestLog::EndMessage;
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, bindingPoint, m_cmdBufferID);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating memory for command buffer, size " << sizeToString(bufferSize) << "." << tcu::TestLog::EndMessage;
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_DRAW);
	}

	if (m_computeData)
	{
		const int			bindingPoint	= (m_computeCmd) ? (1) : (0);
		const int			bufferSize		= (int)(calcDrawBufferSize()*sizeof(tcu::Vec4));

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding data buffer to binding point " << bindingPoint << tcu::TestLog::EndMessage;
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, bindingPoint, m_dataBufferID);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating memory for data buffer, size " << sizeToString(bufferSize) << "." << tcu::TestLog::EndMessage;
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_DRAW);
	}

	if (m_computeIndices)
	{
		const int			bindingPoint	= (m_computeCmd && m_computeData) ? (2) : (m_computeCmd || m_computeData) ? (1) : (0);
		const int			bufferSize		= (int)(calcIndexBufferSize()*sizeof(deUint32));

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding index buffer to binding point " << bindingPoint << tcu::TestLog::EndMessage;
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, bindingPoint, m_indexBufferID);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating memory for index buffer, size " << sizeToString(bufferSize) << "." << tcu::TestLog::EndMessage;
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_DRAW);
	}

	glu::checkError(gl.getError(), "setup buffers", __FILE__, __LINE__);

	// calculate

	m_testCtx.getLog() << tcu::TestLog::Message << "Dispatching compute, size = " << dispatchSize << tcu::TestLog::EndMessage;
	gl.dispatchCompute(dispatchSize.x(), dispatchSize.y(), dispatchSize.z());

	glu::checkError(gl.getError(), "calculate", __FILE__, __LINE__);
}